

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

Id __thiscall dxil_spv::Converter::Impl::build_offset(Impl *this,Id value,uint offset)

{
  Id type_id;
  Operation *this_00;
  Id local_48;
  Id local_44;
  initializer_list<unsigned_int> local_40;
  Operation *local_30;
  Operation *op;
  Builder *builder;
  uint offset_local;
  Id value_local;
  Impl *this_local;
  
  this_local._4_4_ = value;
  if (offset != 0) {
    builder._0_4_ = offset;
    builder._4_4_ = value;
    _offset_local = this;
    op = (Operation *)SPIRVModule::get_builder(this->spirv_module);
    type_id = spv::Builder::makeUintType((Builder *)op,0x20);
    this_00 = allocate(this,OpIAdd,type_id);
    local_48 = builder._4_4_;
    local_30 = this_00;
    local_44 = spv::Builder::makeUintConstant((Builder *)op,(uint)builder,false);
    local_40._M_array = &local_48;
    local_40._M_len = 2;
    Operation::add_ids(this_00,&local_40);
    add(this,local_30,false);
    this_local._4_4_ = local_30->id;
  }
  return this_local._4_4_;
}

Assistant:

spv::Id Converter::Impl::build_offset(spv::Id value, unsigned offset)
{
	if (offset == 0)
		return value;

	auto &builder = spirv_module.get_builder();

	Operation *op = allocate(spv::OpIAdd, builder.makeUintType(32));
	op->add_ids({ value, builder.makeUintConstant(offset) });

	add(op);
	return op->id;
}